

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8 *ptr)

{
  LogMessage *pLVar1;
  uint8 *puVar2;
  int iVar3;
  size_t __n;
  LogMessage local_70;
  LogFinisher local_31;
  
  do {
    puVar2 = this->end_;
    if (this->buffer_end_ == (uint8 *)0x0) {
      iVar3 = ((int)puVar2 - (int)ptr) + 0x10;
      this->buffer_end_ = ptr;
LAB_00161287:
      if (-1 < iVar3) {
        return iVar3;
      }
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
                 ,700);
      pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: s >= 0: ");
      internal::LogFinisher::operator=(&local_31,pLVar1);
      internal::LogMessage::~LogMessage(&local_70);
      return iVar3;
    }
    if (ptr < puVar2 || (long)ptr - (long)puVar2 == 0) {
      __n = (long)ptr - (long)this->buffer_;
      memcpy(this->buffer_end_,this->buffer_,__n);
      this->buffer_end_ = this->buffer_end_ + __n;
      iVar3 = (int)this->end_ - (int)ptr;
      goto LAB_00161287;
    }
    if (this->had_error_ == true) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x2ad);
      pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: !had_error_: ");
      internal::LogFinisher::operator=(&local_31,pLVar1);
      internal::LogMessage::~LogMessage(&local_70);
    }
    iVar3 = (int)((long)ptr - (long)puVar2);
    if (0x10 < iVar3) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x2ae);
      pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: overrun <= kSlopBytes: ");
      internal::LogFinisher::operator=(&local_31,pLVar1);
      internal::LogMessage::~LogMessage(&local_70);
    }
    puVar2 = Next(this);
    ptr = puVar2 + iVar3;
    if (this->had_error_ != false) {
      return 0;
    }
  } while( true );
}

Assistant:

int EpsCopyOutputStream::Flush(uint8* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}